

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docio.cc
# Opt level: O2

bid_t docio_append_commit_mark(docio_handle *handle,uint64_t doc_offset)

{
  byte bVar1;
  undefined8 *buf;
  bid_t bVar2;
  
  buf = (undefined8 *)malloc(0x18);
  bVar1 = _docio_length_checksum((docio_length)(ZEXT816(0x1000000000) << 0x40),handle);
  *buf = 0;
  buf[1] = (ulong)bVar1 << 0x28 | 0x1000000000;
  buf[2] = doc_offset >> 0x38 | (doc_offset & 0xff000000000000) >> 0x28 |
           (doc_offset & 0xff0000000000) >> 0x18 | (doc_offset & 0xff00000000) >> 8 |
           (doc_offset & 0xff000000) << 8 | (doc_offset & 0xff0000) << 0x18 |
           (doc_offset & 0xff00) << 0x28 | doc_offset << 0x38;
  bVar2 = docio_append_doc_raw(handle,0x18,buf);
  free(buf);
  return bVar2;
}

Assistant:

bid_t docio_append_commit_mark(struct docio_handle *handle, uint64_t doc_offset)
{
    // Note: should adapt DOCIO_COMMIT_MARK_SIZE if this function is modified.
    uint32_t offset = 0;
    uint64_t docsize;
    uint64_t _doc_offset;
    void *buf;
    bid_t ret_offset;
    struct docio_length length, _length;

    memset(&length, 0, sizeof(struct docio_length));
    length.flag = DOCIO_TXN_COMMITTED;

    docsize = sizeof(struct docio_length) + sizeof(doc_offset);
    buf = (void *)malloc(docsize);

    _length = _docio_length_encode(length);

    // calculate checksum of LENGTH using crc
    _length.checksum = _docio_length_checksum(_length, handle);

    memcpy((uint8_t *)buf + offset, &_length, sizeof(struct docio_length));
    offset += sizeof(struct docio_length);

    // copy doc_offset
    _doc_offset = _endian_encode(doc_offset);
    memcpy((uint8_t *)buf + offset, &_doc_offset, sizeof(_doc_offset));

    ret_offset = docio_append_doc_raw(handle, docsize, buf);
    free(buf);

    return ret_offset;
}